

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiAxis IVar3;
  bool bVar4;
  ImU32 col;
  ImGuiCol idx;
  char cVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  bool held;
  bool hovered;
  bool local_96;
  bool local_95;
  float local_94;
  float local_90;
  float local_8c;
  float *local_88;
  ImGuiAxis local_7c;
  undefined1 local_78 [16];
  float *local_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImRect local_48;
  
  pIVar2 = GImGui;
  local_78._4_4_ = in_XMM2_Db;
  local_78._0_4_ = hover_extend;
  local_78._8_4_ = in_XMM2_Dc;
  local_78._12_4_ = in_XMM2_Dd;
  pIVar1 = GImGui->CurrentWindow;
  uVar6 = (pIVar1->DC).ItemFlags;
  (pIVar1->DC).ItemFlags = uVar6 | 0x18;
  local_94 = hover_visibility_delay;
  local_90 = min_size2;
  local_8c = min_size1;
  local_88 = size2;
  local_7c = axis;
  local_60 = size1;
  bVar4 = ItemAdd(bb,id,(ImRect *)0x0);
  IVar3 = local_7c;
  (pIVar1->DC).ItemFlags = uVar6;
  cVar5 = '\0';
  if (bVar4) {
    fVar8 = (float)(local_78._0_4_ & (int)((uint)(local_7c == ImGuiAxis_Y) << 0x1f) >> 0x1f);
    fVar7 = (float)(~((int)((uint)(local_7c == ImGuiAxis_Y) << 0x1f) >> 0x1f) & local_78._0_4_);
    local_48.Min.x = (bb->Min).x;
    local_48.Min.y = (bb->Min).y;
    local_48.Max.x = (bb->Max).x;
    local_48.Max.y = (bb->Max).y;
    local_48.Min.y = local_48.Min.y - fVar8;
    local_48.Min.x = local_48.Min.x - fVar7;
    local_48.Max.y = fVar8 + local_48.Max.y;
    local_48.Max.x = fVar7 + local_48.Max.x;
    ButtonBehavior(&local_48,id,&local_95,&local_96,0x180);
    if (pIVar2->ActiveId != id) {
      SetItemAllowOverlap();
    }
    if ((local_96 != false) ||
       (((pIVar2->HoveredId == id && (pIVar2->HoveredIdPreviousFrame == id)) &&
        (local_94 <= pIVar2->HoveredIdTimer)))) {
      SetMouseCursor((IVar3 != ImGuiAxis_Y) + 3);
    }
    local_58 = bb->Min;
    IStack_50 = bb->Max;
    if (local_96 == true) {
      if (IVar3 == ImGuiAxis_Y) {
        fVar7 = ((pIVar2->IO).MousePos.y - (pIVar2->ActiveIdClickOffset).y) - local_48.Min.y;
      }
      else {
        fVar7 = ((pIVar2->IO).MousePos.x - (pIVar2->ActiveIdClickOffset).x) - local_48.Min.x;
      }
      fVar9 = *local_60 - local_8c;
      fVar8 = (float)(~-(uint)(*local_88 - local_90 <= 0.0) & (uint)(*local_88 - local_90));
      fVar10 = -fVar9;
      uVar6 = -(uint)(fVar9 <= fVar10);
      fVar9 = (float)(~uVar6 & (uint)fVar10 | uVar6 & 0x80000000);
      if (fVar9 <= fVar7) {
        fVar9 = fVar7;
      }
      if (fVar9 <= fVar8) {
        fVar8 = fVar9;
      }
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        if ((fVar8 < 0.0) && (*local_60 + fVar8 < local_8c)) {
          local_78 = ZEXT416((uint)fVar8);
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x56e,"SplitterBehavior","ImGui ASSERT FAILED: %s",
                      "*size1 + mouse_delta >= min_size1");
          fVar8 = (float)local_78._0_4_;
          uVar11 = local_78._4_4_;
          uVar12 = local_78._8_4_;
          uVar13 = local_78._12_4_;
        }
        if ((0.0 < fVar8) && (*local_88 - fVar8 < local_90)) {
          local_78._4_4_ = uVar11;
          local_78._0_4_ = fVar8;
          local_78._8_4_ = uVar12;
          local_78._12_4_ = uVar13;
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                      ,0x570,"SplitterBehavior","ImGui ASSERT FAILED: %s",
                      "*size2 - mouse_delta >= min_size2");
          fVar8 = (float)local_78._0_4_;
        }
        *local_60 = *local_60 + fVar8;
        *local_88 = *local_88 - fVar8;
        fVar7 = (float)((uint)fVar8 & (int)((uint)(IVar3 == ImGuiAxis_X) << 0x1f) >> 0x1f);
        fVar8 = (float)(~((int)((uint)(IVar3 == ImGuiAxis_X) << 0x1f) >> 0x1f) & (uint)fVar8);
        local_58.y = fVar8 + local_58.y;
        local_58.x = fVar7 + local_58.x;
        IStack_50.y = fVar8 + IStack_50.y;
        IStack_50.x = fVar7 + IStack_50.x;
        MarkItemEdited(id);
      }
    }
    idx = 0x1d;
    if ((local_96 == false) && (idx = 0x1b, local_95 == true)) {
      idx = 0x1c - (uint)(pIVar2->HoveredIdTimer < local_94);
    }
    col = GetColorU32(idx,1.0);
    ImDrawList::AddRectFilled(pIVar1->DrawList,&local_58,&IStack_50,col,0.0,0xf);
    cVar5 = local_96;
  }
  return (bool)cVar5;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, 0.0f);

    return held;
}